

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O0

void setallfields(lua_State *L,tm *stm)

{
  tm *stm_local;
  lua_State *L_local;
  
  setfield(L,"sec",stm->tm_sec);
  setfield(L,"min",stm->tm_min);
  setfield(L,"hour",stm->tm_hour);
  setfield(L,"day",stm->tm_mday);
  setfield(L,"month",stm->tm_mon + 1);
  setfield(L,"year",stm->tm_year + 0x76c);
  setfield(L,"wday",stm->tm_wday + 1);
  setfield(L,"yday",stm->tm_yday + 1);
  setboolfield(L,"isdst",stm->tm_isdst);
  return;
}

Assistant:

static void setallfields(lua_State *L, struct tm *stm) {
    setfield(L, "sec", stm->tm_sec);
    setfield(L, "min", stm->tm_min);
    setfield(L, "hour", stm->tm_hour);
    setfield(L, "day", stm->tm_mday);
    setfield(L, "month", stm->tm_mon + 1);
    setfield(L, "year", stm->tm_year + 1900);
    setfield(L, "wday", stm->tm_wday + 1);
    setfield(L, "yday", stm->tm_yday + 1);
    setboolfield(L, "isdst", stm->tm_isdst);
}